

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O3

int duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<unsigned_long,int>
              (unsigned_long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  uint uVar1;
  string local_48;
  
  if (0x7fffffff < input) {
    CastExceptionText<unsigned_long,int>(&local_48,(duckdb *)input,idx);
    uVar1 = HandleVectorCastError::Operation<int>(&local_48,mask,idx,(VectorTryCastData *)dataptr);
    input = (unsigned_long)uVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return (int)input;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}